

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O3

IterateResult __thiscall gl4cts::KHRDebug::LabelsTest::iterate(LabelsTest *this)

{
  GLuint GVar1;
  GLenum GVar2;
  GLenum GVar3;
  TestError *this_00;
  long lVar4;
  EVP_PKEY_CTX *in_RSI;
  long lVar5;
  GLsizei length;
  GLchar buffer [32];
  GLsizei local_1c4;
  TestBase *local_1c0;
  GLchar local_1b8;
  char cStack_1b7;
  char cStack_1b6;
  undefined4 uStack_1b5;
  undefined4 uStack_1b1;
  undefined5 uStack_1ad;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  
  local_1c0 = &this->super_TestBase;
  TestBase::init(local_1c0,in_RSI);
  lVar5 = 0xb;
  lVar4 = 0x20d25c8;
  do {
    GVar3 = *(GLenum *)(lVar4 + -0x18);
    GVar1 = (**(code **)(lVar4 + -0x10))((this->super_TestBase).m_gl,(this->super_TestBase).m_rc);
    local_1a8 = 0;
    uStack_1a0 = 0;
    local_1b8 = 'H';
    cStack_1b7 = 'e';
    cStack_1b6 = 'l';
    uStack_1b5 = 0x6f576f6c;
    uStack_1b1 = 0x646c72;
    uStack_1ad = 0;
    (*((this->super_TestBase).m_gl)->getObjectLabel)(GVar3,GVar1,0x20,&local_1c4,&local_1b8);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2d1);
    if (local_1c4 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Just created object has label of length != 0",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2d5);
LAB_008bd11a:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    if (local_1b8 != '\0') {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Just created object has not empty label",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2da);
      goto LAB_008bd11a;
    }
    (*((this->super_TestBase).m_gl)->objectLabel)(GVar3,GVar1,-1,"foo");
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"ObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2e3);
    (*((this->super_TestBase).m_gl)->getObjectLabel)(GVar3,GVar1,0x20,&local_1c4,&local_1b8);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2e6);
    if (local_1c4 != 3) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Length is different than length of set label",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2ea);
      goto LAB_008bd11a;
    }
    if (CONCAT13((undefined1)uStack_1b5,CONCAT12(cStack_1b6,CONCAT11(cStack_1b7,local_1b8))) !=
        0x6f6f66) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Different label returned",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2ef);
      goto LAB_008bd11a;
    }
    local_1c4 = 0;
    (*((this->super_TestBase).m_gl)->getObjectLabel)(GVar3,GVar1,0,&local_1c4,(GLchar *)0x0);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x2f8);
    if (local_1c4 != 3) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid length returned when label and bufSize are set to 0",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x2fc);
      goto LAB_008bd11a;
    }
    local_1c4 = 0;
    local_1b8 = 'H';
    cStack_1b7 = 'e';
    cStack_1b6 = 'l';
    uStack_1b5 = 0x6f576f6c;
    uStack_1b1 = 0x646c72;
    (*((this->super_TestBase).m_gl)->getObjectLabel)(GVar3,GVar1,2,&local_1c4,&local_1b8);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x308);
    if (local_1b8 != 'f') {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Different label returned",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x30c);
      goto LAB_008bd11a;
    }
    if (cStack_1b7 != '\0') {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"GetObjectLabel did not stored NULL at the end of string",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x311);
      goto LAB_008bd11a;
    }
    if (cStack_1b6 != 'l') {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"GetObjectLabel overflowed buffer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x316);
      goto LAB_008bd11a;
    }
    local_1c4 = 0;
    local_1b8 = 'H';
    cStack_1b7 = 'e';
    cStack_1b6 = 'l';
    uStack_1b5 = 0x6f576f6c;
    uStack_1b1 = 0x646c72;
    (*((this->super_TestBase).m_gl)->getObjectLabel)(GVar3,GVar1,0,&local_1c4,&local_1b8);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x321);
    if (CONCAT44(uStack_1b1,uStack_1b5) != 0x646c726f576f6c ||
        CONCAT17((undefined1)uStack_1b1,
                 CONCAT43(uStack_1b5,CONCAT12(cStack_1b6,CONCAT11(cStack_1b7,local_1b8)))) !=
        0x726f576f6c6c6548) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"GetObjectLabel modified buffer, bufSize set to 0",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x325);
      goto LAB_008bd11a;
    }
    (*((this->super_TestBase).m_gl)->objectLabel)
              (GVar3,GVar1,-1,::glcts::fixed_sample_locations_values + 1);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"ObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x32e);
    (*((this->super_TestBase).m_gl)->getObjectLabel)(GVar3,GVar1,0x20,&local_1c4,&local_1b8);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x331);
    if (local_1c4 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Label length is != 0, empty string was set",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x335);
      goto LAB_008bd11a;
    }
    if (local_1b8 != '\0') {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Non empty label returned, empty string was set",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x33a);
      goto LAB_008bd11a;
    }
    (*((this->super_TestBase).m_gl)->objectLabel)(GVar3,GVar1,2,(GLchar *)0x0);
    GVar2 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar2,"ObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x343);
    (*((this->super_TestBase).m_gl)->getObjectLabel)(GVar3,GVar1,0x20,&local_1c4,&local_1b8);
    GVar3 = (*((this->super_TestBase).m_gl)->getError)();
    glu::checkError(GVar3,"GetObjectLabel",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x346);
    if (local_1c4 != 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Label length is != 0, label was removed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x34a);
      goto LAB_008bd11a;
    }
    if (local_1b8 != '\0') {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Different label returned, label was removed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                 ,0x34f);
      goto LAB_008bd11a;
    }
    (**(code **)(lVar4 + -8))((this->super_TestBase).m_gl);
    lVar4 = lVar4 + 0x20;
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      tcu::TestContext::setTestResult
                (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
      TestBase::done(local_1c0);
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult LabelsTest::iterate()
{
	static const labelsTestCase test_cases[] = {
		{ GL_BUFFER, createBuffer, deleteBuffer, "Buffer" },
		{ GL_FRAMEBUFFER, createFramebuffer, deleteFramebuffer, "Framebuffer" },
		{ GL_PROGRAM, createProgram, deleteProgram, "Program" },
		{ GL_PROGRAM_PIPELINE, createProgramPipeline, deleteProgramPipeline, "ProgramPipeline" },
		{ GL_QUERY, createQuery, deleteQuery, "Query" },
		{ GL_RENDERBUFFER, createRenderbuffer, deleteRenderbuffer, "Renderbuffer" },
		{ GL_SAMPLER, createSampler, deleteSampler, "Sampler" },
		{ GL_SHADER, createShader, deleteShader, "Shader" },
		{ GL_TEXTURE, createTexture, deleteTexture, "Texture" },
		{ GL_TRANSFORM_FEEDBACK, createTransformFeedback, deleteTransformFeedback, "TransformFeedback" },
		{ GL_VERTEX_ARRAY, createVertexArray, deleteVertexArray, "VertexArray" },
	};

	static const size_t n_test_cases = sizeof(test_cases) / sizeof(test_cases[0]);

	static const GLsizei bufSize	  = 32;
	static const GLchar  label[]	  = "foo";
	static const GLsizei label_length = (GLsizei)(sizeof(label) / sizeof(label[0]) - 1);

	/* Initialize render context */
	TestBase::init();

	/* For each test case */
	for (size_t test_case_index = 0; test_case_index < n_test_cases; ++test_case_index)
	{
		const labelsTestCase& test_case = test_cases[test_case_index];

		const GLenum identifier = test_case.m_identifier;
		const GLuint id			= test_case.m_create(m_gl, m_rc);

		try
		{
			GLchar  buffer[bufSize] = "HelloWorld";
			GLsizei length;

			/*
			 * - query label; It is expected that result will be an empty string and length
			 * will be zero;
			 */
			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != length)
			{
				TCU_FAIL("Just created object has label of length != 0");
			}

			if (0 != buffer[0])
			{
				TCU_FAIL("Just created object has not empty label");
			}

			/*
			 * - assign label to object;
			 * - query label; It is expected that result will be equal to the provided
			 * label and length will be correct;
			 */
			m_gl->objectLabel(identifier, id, -1 /* length */, label);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "ObjectLabel");

			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (label_length != length)
			{
				TCU_FAIL("Length is different than length of set label");
			}

			if (0 != strcmp(buffer, label))
			{
				TCU_FAIL("Different label returned");
			}

			/*
			 * - query length only; Correct value is expected;
			 */
			length = 0;

			m_gl->getObjectLabel(identifier, id, 0 /* bufSize */, &length, 0 /* label */);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (label_length != length)
			{
				TCU_FAIL("Invalid length returned when label and bufSize are set to 0");
			}

			/*
			 * - query label with <bufSize> less than actual length of label; It is
			 * expected that only <bufSize> characters will be stored in buffer (including
			 * NULL);
			 */
			length = 0;
			strcpy(buffer, "HelloWorld");

			m_gl->getObjectLabel(identifier, id, 2 /* bufSize */, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (buffer[0] != label[0])
			{
				TCU_FAIL("Different label returned");
			}

			if (buffer[1] != 0)
			{
				TCU_FAIL("GetObjectLabel did not stored NULL at the end of string");
			}

			if (buffer[2] != 'l')
			{
				TCU_FAIL("GetObjectLabel overflowed buffer");
			}

			/*
			 * - query label with <bufSize> equal zero; It is expected that buffer contents
			 * will not be modified;
			 */
			length = 0;
			strcpy(buffer, "HelloWorld");

			m_gl->getObjectLabel(identifier, id, 0 /* bufSize */, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != strcmp(buffer, "HelloWorld"))
			{
				TCU_FAIL("GetObjectLabel modified buffer, bufSize set to 0");
			}

			/*
			 * - assign empty string as label to object;
			 * - query label, it is expected that result will be an empty string and length
			 * will be zero;
			 */
			m_gl->objectLabel(identifier, id, -1 /* length */, "");
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "ObjectLabel");

			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != length)
			{
				TCU_FAIL("Label length is != 0, empty string was set");
			}

			if (0 != buffer[0])
			{
				TCU_FAIL("Non empty label returned, empty string was set");
			}

			/*
			 * - assign NULL as label to object;
			 * - query label, it is expected that result will be an empty string and length
			 * will be zero;
			 */
			m_gl->objectLabel(identifier, id, 2, 0 /* label */);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "ObjectLabel");

			m_gl->getObjectLabel(identifier, id, bufSize, &length, buffer);
			GLU_EXPECT_NO_ERROR(m_gl->getError(), "GetObjectLabel");

			if (0 != length)
			{
				TCU_FAIL("Label length is != 0, label was removed");
			}

			if (0 != buffer[0])
			{
				TCU_FAIL("Different label returned, label was removed");
			}
		}
		catch (const std::exception& exc)
		{
			test_case.m_destroy(m_gl, id);

			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "Error during test case: " << test_case.m_name << tcu::TestLog::EndMessage;

			TCU_FAIL(exc.what());
		}

		test_case.m_destroy(m_gl, id);
	}

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	TestBase::done();

	return tcu::TestNode::STOP;
}